

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O1

pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> * __thiscall
Corrade::Utility::Configuration::parse
          (pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>
           *__return_storage_ptr__,Configuration *this,StringView in,ConfigurationGroup *group,
          StringView fullPath)

{
  byte *pbVar1;
  pointer pVVar2;
  size_type sVar3;
  StringView prefix;
  StringView prefix_00;
  StringView fullPath_00;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  type begin;
  StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  ostream *poVar11;
  size_t sVar12;
  string *psVar13;
  ulong uVar14;
  StringView b;
  StringView other;
  StringView in_00;
  StringView other_00;
  StringView SVar15;
  StringView other_01;
  StringView other_02;
  StringView other_03;
  BasicStringView<const_char> BVar16;
  ArrayView<const_char> AVar17;
  StringView b_00;
  Value item;
  StringView nextSubGroup;
  Array3<Containers::StringView> keyValue;
  StringView nextGroup;
  StringView local_148;
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  char *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  Configuration *local_f8;
  ConfigurationGroup *local_f0;
  StringView local_e8;
  BasicStringView<const_char> local_d8;
  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
  *local_c8;
  char *local_c0;
  anon_union_24_2_2c69c8ed_for_String_0 local_b8;
  string local_98;
  BasicStringView<const_char> local_78;
  BasicStringView<const_char> local_68;
  ulong local_58;
  BasicStringView<const_char> local_50;
  BasicStringView<const_char> local_40;
  
  local_148 = in;
  local_f8 = this;
  local_f0 = group;
  if (((fullPath._data != (char *)0x0) &&
      (((undefined1  [16])fullPath & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0)
      ) && (bVar6 = Containers::BasicStringView<const_char>::hasSuffix(&fullPath,'/'), !bVar6)) {
    poVar11 = Error::defaultOutput();
    Error::Error((Error *)local_138,poVar11,(Flags)0x0);
    Debug::operator<<((Debug *)local_138,
                      "Assertion !fullPath || fullPath.hasSuffix(\'/\') failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:125"
                     );
LAB_00116ce4:
    Error::~Error((Error *)local_138);
    abort();
  }
  if (((undefined1  [16])local_148 & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0)
  {
    local_c8 = &local_f0->_groups;
    bVar6 = false;
    sVar12 = local_148._sizePlusFlags;
    do {
      pcVar10 = local_148._data;
      local_e8 = local_148;
      begin = Containers::Implementation::stringFindCharacter();
      local_c0 = pcVar10;
      if (begin == (type)0x0) {
        pcVar10 = pcVar10 + (sVar12 & 0x3fffffffffffffff);
        uVar14 = 0;
      }
      else {
        BVar16 = Containers::BasicStringView<const_char>::slice
                           (&local_148,(char *)begin,(char *)(begin + 1));
        pcVar10 = BVar16._data;
        uVar14 = BVar16._sizePlusFlags & 0x3fffffffffffffff;
      }
      if (pcVar10 == (char *)0x0) {
        local_e8 = (StringView)(ZEXT816(0x8000000000000000) << 0x40);
      }
      else {
        local_e8 = Containers::BasicStringView<const_char>::slice
                             (&local_148,local_148._data,pcVar10);
      }
      local_148 = Containers::BasicStringView<const_char>::suffix(&local_148,pcVar10 + uVar14);
      bVar7 = Containers::BasicStringView<const_char>::hasSuffix(&local_e8,'\r');
      if (bVar7) {
        pbVar1 = (byte *)((long)&(local_f8->_flags)._value + 2);
        *pbVar1 = *pbVar1 | 4;
      }
      if (bVar6) {
        local_138._0_8_ = local_e8._data;
        local_138._8_8_ = local_e8._sizePlusFlags;
        BVar16 = Containers::BasicStringView<const_char>::trimmed
                           ((BasicStringView<const_char> *)local_138);
        b._sizePlusFlags = 0xc000000000000003;
        b._data = "\"\"\"";
        sVar12 = 0xc000000000000003;
        bVar7 = Containers::operator==(BVar16,b);
        if (bVar7) {
          pVVar2 = (local_f0->_values).
                   super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          sVar3 = pVVar2[-1].value._M_string_length;
          bVar7 = false;
          if (sVar3 == 0) {
            bVar6 = false;
          }
          else {
            psVar13 = &pVVar2[-1].value;
            if ((psVar13->_M_dataplus)._M_p[sVar3 - 1] != '\n') {
              poVar11 = Error::defaultOutput();
              Error::Error((Error *)local_138,poVar11,(Flags)0x0);
              Debug::operator<<((Debug *)local_138,
                                "Assertion group->_values.back().value.back() == \'\\n\' failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:148"
                               );
              goto LAB_00116ce4;
            }
            bVar6 = false;
            std::__cxx11::string::resize((ulong)psVar13,(char)sVar3 + -1);
          }
        }
        else {
          bVar7 = Containers::BasicStringView<const_char>::hasSuffix(&local_e8,'\r');
          if (bVar7) {
            local_e8 = Containers::BasicStringView<const_char>::slice
                                 (&local_e8,0,(local_e8._sizePlusFlags & 0x3fffffffffffffff) - 1);
          }
          other_00._sizePlusFlags = sVar12;
          other_00._data = (char *)local_e8._sizePlusFlags;
          Containers::Implementation::
          StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::to((string *)local_138,
               (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8._data,other_00);
          std::__cxx11::string::_M_append
                    ((char *)&(local_f0->_values).
                              super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].value,local_138._0_8_);
          if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
            operator_delete((void *)local_138._0_8_);
          }
          std::__cxx11::string::push_back
                    ((char)(local_f0->_values).
                           super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -0x20);
          bVar7 = false;
        }
      }
      else {
        local_e8 = Containers::BasicStringView<const_char>::trimmed(&local_e8);
        if (local_e8._data == (char *)0x0 ||
            ((undefined1  [16])local_e8 & (undefined1  [16])0x3fffffffffffffff) ==
            (undefined1  [16])0x0) {
          bVar7 = false;
          if (((local_f8->_flags)._value & 0x10) == 0) {
            bVar7 = false;
            if ((local_148._data != (char *)0x0) &&
               (((undefined1  [16])local_148 & (undefined1  [16])0x3fffffffffffffff) !=
                (undefined1  [16])0x0)) {
              std::
              vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
              ::emplace_back<>(&local_f0->_values);
            }
          }
        }
        else {
          bVar7 = Containers::BasicStringView<const_char>::hasPrefix(&local_e8,'[');
          if (bVar7) {
            bVar7 = Containers::BasicStringView<const_char>::hasSuffix(&local_e8,']');
            if (bVar7) {
              local_138._0_16_ =
                   (undefined1  [16])
                   Containers::BasicStringView<const_char>::slice
                             (&local_e8,1,(local_e8._sizePlusFlags & 0x3fffffffffffffff) - 1);
              local_68 = Containers::BasicStringView<const_char>::trimmed
                                   ((BasicStringView<const_char> *)local_138);
              if (local_68._data == (char *)0x0 ||
                  ((undefined1  [16])local_68 & (undefined1  [16])0x3fffffffffffffff) ==
                  (undefined1  [16])0x0) {
                (__return_storage_ptr__->first)._data = (char *)0x0;
                (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
                pcVar10 = "empty group name";
                goto LAB_001169bd;
              }
              prefix._sizePlusFlags = fullPath._sizePlusFlags;
              prefix._data = fullPath._data;
              bVar7 = Containers::BasicStringView<const_char>::hasPrefix(&local_68,prefix);
              if (bVar7) {
                local_138._8_8_ = 0;
                local_138._0_8_ = local_138 + 0x10;
                local_138[0x10] = '\0';
                prefix_00._sizePlusFlags = fullPath._sizePlusFlags;
                prefix_00._data = fullPath._data;
                local_d8 = Containers::BasicStringView<const_char>::exceptPrefix
                                     (&local_68,prefix_00);
                BVar16 = Containers::BasicStringView<const_char>::find(&local_d8,'/');
                end = (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)BVar16._data;
                local_58 = BVar16._sizePlusFlags & 0x3fffffffffffffff;
                bVar7 = ((undefined1  [16])BVar16 & (undefined1  [16])0x3fffffffffffffff) !=
                        (undefined1  [16])0x0;
                other_03._sizePlusFlags =
                     CONCAT71(0x3fffffffffffff,
                              bVar7 && end != (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)0x0);
                if (bVar7 && end != (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)0x0) {
                  if (end == (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_d8._data) {
                    (__return_storage_ptr__->first)._data = (char *)0x0;
                    (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
                    __return_storage_ptr__->second = "empty subgroup name";
                  }
                  else {
                    BVar16 = Containers::BasicStringView<const_char>::slice
                                       (&local_d8,local_d8._data,(char *)end);
                    other._data = (char *)BVar16._sizePlusFlags;
                    other._sizePlusFlags = other_03._sizePlusFlags;
                    Containers::Implementation::
                    StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::to(&local_98,
                         (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)BVar16._data,other);
                    std::__cxx11::string::operator=((string *)local_138,(string *)&local_98);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_98._M_dataplus._M_p != &local_98.field_2) {
                      operator_delete(local_98._M_dataplus._M_p);
                    }
                    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)operator_new(0x38);
                    ConfigurationGroup::ConfigurationGroup
                              ((ConfigurationGroup *)paVar9,
                               (local_f8->super_ConfigurationGroup)._configuration);
                    local_118._M_p = (pointer)paVar9;
                    std::
                    vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                    ::emplace_back<Corrade::Utility::ConfigurationGroup::Group>
                              (local_c8,(Group *)local_138);
                    _Var4._M_p = local_118._M_p;
                    local_50 = Containers::BasicStringView<const_char>::slice
                                         (&local_68,local_68._data,(char *)(end + local_58));
                    in_00._sizePlusFlags = sVar12;
                    in_00._data = local_c0;
                    parse((pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *)
                          &local_98,local_f8,in_00,(ConfigurationGroup *)_Var4._M_p,local_50);
                    AVar17 = Containers::Implementation::
                             ArrayViewConverter<const_char,_Corrade::Containers::BasicStringView<const_char>_>
                             ::from((BasicStringView<const_char> *)&local_98);
                    if ((char *)local_98.field_2._M_allocated_capacity == (char *)0x0) {
                      Containers::BasicStringView<const_char>::BasicStringView
                                ((BasicStringView<const_char> *)&local_98,AVar17._data,AVar17._size,
                                 (StringViewFlags)0x0);
                      local_148._sizePlusFlags = local_98._M_string_length;
                      local_148._data = local_98._M_dataplus._M_p;
                      goto LAB_001167a3;
                    }
                    (__return_storage_ptr__->first)._data = AVar17._data;
                    (__return_storage_ptr__->first)._sizePlusFlags = AVar17._size;
                    __return_storage_ptr__->second = (char *)local_98.field_2._M_allocated_capacity;
                  }
                }
                else {
                  other_03._data = (char *)local_d8._sizePlusFlags;
                  Containers::Implementation::
                  StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::to(&local_98,
                       (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_d8._data,other_03);
                  std::__cxx11::string::operator=((string *)local_138,(string *)&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p != &local_98.field_2) {
                    operator_delete(local_98._M_dataplus._M_p);
                  }
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)operator_new(0x38);
                  ConfigurationGroup::ConfigurationGroup
                            ((ConfigurationGroup *)paVar9,
                             (local_f8->super_ConfigurationGroup)._configuration);
                  local_118._M_p = (pointer)paVar9;
                  std::
                  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                  ::emplace_back<Corrade::Utility::ConfigurationGroup::Group>
                            (local_c8,(Group *)local_138);
                  _Var4._M_p = local_118._M_p;
                  SVar15 = local_148;
                  b_00._sizePlusFlags = 0xc000000000000001;
                  b_00._data = "/";
                  Containers::operator+((String *)&local_b8._small,local_68,b_00);
                  AVar17 = Containers::String::operator_cast_to_ArrayView
                                     ((String *)&local_b8._small);
                  Containers::BasicStringView<const_char>::BasicStringView
                            (&local_40,AVar17._data,AVar17._size,(StringViewFlags)0x0);
                  fullPath_00._sizePlusFlags = local_40._sizePlusFlags;
                  fullPath_00._data = local_40._data;
                  parse((pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *)
                        &local_98,local_f8,SVar15,(ConfigurationGroup *)_Var4._M_p,fullPath_00);
                  AVar17 = Containers::Implementation::
                           ArrayViewConverter<const_char,_Corrade::Containers::BasicStringView<const_char>_>
                           ::from((BasicStringView<const_char> *)&local_98);
                  uVar5 = local_98.field_2._M_allocated_capacity;
                  Containers::String::~String((String *)&local_b8._small);
                  if ((char *)uVar5 == (char *)0x0) {
                    Containers::BasicStringView<const_char>::BasicStringView
                              ((BasicStringView<const_char> *)&local_98,AVar17._data,AVar17._size,
                               (StringViewFlags)0x0);
                    local_148._sizePlusFlags = local_98._M_string_length;
                    local_148._data = local_98._M_dataplus._M_p;
LAB_001167a3:
                    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
                      operator_delete((void *)local_138._0_8_);
                    }
                    bVar7 = false;
                    goto LAB_001169c6;
                  }
                  (__return_storage_ptr__->first)._data = AVar17._data;
                  (__return_storage_ptr__->first)._sizePlusFlags = AVar17._size;
                  __return_storage_ptr__->second = (char *)uVar5;
                }
                if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
                  operator_delete((void *)local_138._0_8_);
                }
              }
              else {
                (__return_storage_ptr__->first)._data = local_c0;
                (__return_storage_ptr__->first)._sizePlusFlags = sVar12;
                __return_storage_ptr__->second = (char *)0x0;
              }
            }
            else {
              (__return_storage_ptr__->first)._data = (char *)0x0;
              (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
              pcVar10 = "missing closing bracket for a group header";
LAB_001169bd:
              __return_storage_ptr__->second = pcVar10;
            }
            bVar7 = true;
          }
          else {
            pcVar10 = Containers::BasicStringView<const_char>::operator[](&local_e8,0);
            if ((*pcVar10 == '#') ||
               (pcVar10 = Containers::BasicStringView<const_char>::operator[](&local_e8,0),
               *pcVar10 == ';')) {
              bVar7 = false;
              if (((local_f8->_flags)._value & 0x10) == 0) {
                local_138._8_8_ = 0;
                local_138._0_8_ = local_138 + 0x10;
                local_138[0x10] = '\0';
                local_118._M_p = (pointer)&local_108;
                local_110 = (char *)0x0;
                local_108._M_local_buf[0] = '\0';
                SVar15._sizePlusFlags = 0;
                SVar15._data = (char *)local_e8._sizePlusFlags;
                Containers::Implementation::
                StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::to(&local_98,
                     (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_e8._data,SVar15);
                std::__cxx11::string::operator=((string *)&local_118,(string *)&local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p);
                }
                std::
                vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                ::push_back(&local_f0->_values,(value_type *)local_138);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_p != &local_108) {
                  operator_delete(local_118._M_p);
                }
                goto LAB_001167a3;
              }
              goto LAB_001169c6;
            }
            Containers::BasicStringView<const_char>::partition
                      ((Array3<BasicStringView<const_char>_> *)&local_98,&local_e8,'=');
            if (((char *)local_98.field_2._M_allocated_capacity == (char *)0x0) ||
               ((local_98.field_2._8_8_ & 0x3fffffffffffffff) == 0)) {
              (__return_storage_ptr__->first)._data = (char *)0x0;
              (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
              pcVar10 = "missing equals for a value";
              goto LAB_001169bd;
            }
            sVar12 = 0;
            local_138._8_8_ = 0;
            local_138._0_8_ = local_138 + 0x10;
            local_138[0x10] = '\0';
            local_118._M_p = (pointer)&local_108;
            local_110 = (char *)0x0;
            local_108._M_local_buf[0] = '\0';
            BVar16 = Containers::BasicStringView<const_char>::trimmed
                               ((BasicStringView<const_char> *)&local_98);
            other_01._data = (char *)BVar16._sizePlusFlags;
            other_01._sizePlusFlags = sVar12;
            Containers::Implementation::
            StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::to((string *)&local_b8._small,
                 (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)BVar16._data,other_01);
            std::__cxx11::string::operator=((string *)local_138,(string *)&local_b8._small);
            if (local_b8._large.data != local_b8._small.data + 0x10) {
              operator_delete(local_b8._large.data);
            }
            BVar16 = Containers::BasicStringView<const_char>::trimmed(&local_78);
            other_02._data = (char *)BVar16._sizePlusFlags;
            other_02._sizePlusFlags = sVar12;
            Containers::Implementation::
            StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::to((string *)&local_b8._small,
                 (StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)BVar16._data,other_02);
            std::__cxx11::string::operator=((string *)&local_118,(string *)&local_b8._small);
            if (local_b8._large.data != local_b8._small.data + 0x10) {
              operator_delete(local_b8._large.data);
            }
            iVar8 = std::__cxx11::string::compare((char *)&local_118);
            if (iVar8 == 0) {
              bVar6 = true;
              std::__cxx11::string::_M_replace((ulong)&local_118,0,local_110,0x13244e);
LAB_00116b70:
              bVar7 = false;
              std::
              vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
              ::push_back(&local_f0->_values,(value_type *)local_138);
            }
            else {
              if ((local_110 == (char *)0x0) || (*local_118._M_p != '\"')) goto LAB_00116b70;
              if ((local_110 != (char *)0x1) && ((local_118._M_p + -1)[(long)local_110] == '\"')) {
                std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_118);
                std::__cxx11::string::operator=((string *)&local_118,(string *)&local_b8._small);
                if (local_b8._large.data != local_b8._small.data + 0x10) {
                  operator_delete(local_b8._large.data);
                }
                goto LAB_00116b70;
              }
              (__return_storage_ptr__->first)._data = (char *)0x0;
              (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
              __return_storage_ptr__->second = "missing closing quote for a value";
              bVar7 = true;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_p != &local_108) {
              operator_delete(local_118._M_p);
            }
            if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
              operator_delete((void *)local_138._0_8_);
            }
          }
        }
      }
LAB_001169c6:
      if (bVar7) {
        return __return_storage_ptr__;
      }
      sVar12 = local_148._sizePlusFlags;
    } while (((undefined1  [16])local_148 & (undefined1  [16])0x3fffffffffffffff) !=
             (undefined1  [16])0x0);
    if (bVar6) {
      (__return_storage_ptr__->first)._data = (char *)0x0;
      (__return_storage_ptr__->first)._sizePlusFlags = 0x8000000000000000;
      pcVar10 = "missing closing quotes for a multi-line value";
      goto LAB_00116ca3;
    }
  }
  (__return_storage_ptr__->first)._data = local_148._data;
  (__return_storage_ptr__->first)._sizePlusFlags = local_148._sizePlusFlags;
  pcVar10 = (char *)0x0;
LAB_00116ca3:
  __return_storage_ptr__->second = pcVar10;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Containers::StringView, const char*> Configuration::parse(Containers::StringView in, ConfigurationGroup* group, const Containers::StringView fullPath) {
    CORRADE_INTERNAL_ASSERT(!fullPath || fullPath.hasSuffix('/'));

    /* Parse file */
    bool multiLineValue = false;
    while(!in.isEmpty()) {
        const Containers::StringView currentLine = in;

        /* Extract the line and ignore the newline character after it, if any */
        Containers::StringView buffer = in;
        const Containers::StringView end = in.findOr('\n', in.end());
        buffer = in.prefix(end.begin());
        in = in.suffix(end.end());

        /* Windows EOL */
        if(buffer.hasSuffix('\r'))
            _flags |= InternalFlag::WindowsEol;

        /* Multi-line value */
        if(multiLineValue) {
            /* End of multi-line value */
            if(Containers::StringView{buffer}.trimmed() == "\"\"\""_s) {
                /* Remove trailing newline, if present */
                if(!group->_values.back().value.empty()) {
                    CORRADE_INTERNAL_ASSERT(group->_values.back().value.back() == '\n');
                    group->_values.back().value.resize(group->_values.back().value.size()-1);
                }

                multiLineValue = false;
                continue;
            }

            /* Remove Windows EOL, if present */
            if(buffer.hasSuffix('\r')) buffer = buffer.exceptSuffix(1);

            /* Append it (with newline) to current value */
            group->_values.back().value += buffer;
            group->_values.back().value += '\n';
            continue;
        }

        /* Trim buffer */
        buffer = buffer.trimmed();

        /* Empty line */
        if(!buffer) {
            if(_flags & InternalFlag::SkipComments) continue;

            /* Save it only if this is not the last one */
            if(in) group->_values.emplace_back();

        /* Group header */
        } else if(buffer.hasPrefix('[')) {

            /* Check ending bracket */
            if(!buffer.hasSuffix(']'))
                return {nullptr, "missing closing bracket for a group header"};

            const Containers::StringView nextGroup = buffer.slice(1, buffer.size()-1).trimmed();

            if(!nextGroup)
                return {nullptr, "empty group name"};

            /* This is a subgroup of this one, parse recursively */
            if(nextGroup.hasPrefix(fullPath)) {
                ConfigurationGroup::Group g;

                /* If the subgroup has a shorthand for multiple nesting, call
                   parse() on this same line again but with nested group and
                   larger fullPath */
                const Containers::StringView nextSubGroup = nextGroup.exceptPrefix(fullPath);
                if(const Containers::StringView groupEnd = nextSubGroup.find('/')) {
                    if(groupEnd.begin() == nextSubGroup.begin())
                        return {nullptr, "empty subgroup name"};

                    g.name = nextSubGroup.prefix(groupEnd.begin());
                    g.group = new ConfigurationGroup(_configuration);
                    /* Add the group before attempting any other parsing, as it
                       could throw an exception and the group would otherwise
                       be leaked */
                    group->_groups.push_back(std::move(g));
                    std::pair<Containers::ArrayView<const char>, const char*> parsed = parse(currentLine, g.group, nextGroup.prefix(groupEnd .end()));
                    if(parsed.second) return parsed; /* Error, bubble up */
                    in = parsed.first;

                /* Otherwise call parse() on the next line */
                } else {
                    g.name = nextSubGroup;
                    g.group = new ConfigurationGroup(_configuration);
                    /* Add the group before attempting any other parsing, as it
                       could throw an exception and the group would otherwise
                       be leaked */
                    group->_groups.push_back(std::move(g));
                    std::pair<Containers::ArrayView<const char>, const char*> parsed = parse(in, g.group, nextGroup + "/"_s);
                    if(parsed.second) return parsed; /* Error, bubble up */
                    in = parsed.first;
                }

            /* Otherwise it's a subgroup of some parent, return the control
               back to caller (again with this line) */
            } else return {currentLine, nullptr};

        /* Comment */
        } else if(buffer[0] == '#' || buffer[0] == ';') {
            if(_flags & InternalFlag::SkipComments) continue;

            ConfigurationGroup::Value item;
            item.value = buffer;
            group->_values.push_back(item);

        /* Key/value pair */
        } else {
            const Containers::Array3<Containers::StringView> keyValue = buffer.partition('=');
            if(!keyValue[1])
                return {nullptr, "missing equals for a value"};

            ConfigurationGroup::Value item;
            item.key = keyValue[0].trimmed();
            item.value = keyValue[2].trimmed();

            /* Start of multi-line value */
            if(item.value == "\"\"\"") {
                item.value = "";
                multiLineValue = true;

            /* Remove quotes, if present */
            /** @todo Check `"` characters better */
            } else if(!item.value.empty() && item.value[0] == '"') {
                if(item.value.size() < 2 || item.value[item.value.size()-1] != '"')
                    return {nullptr, "missing closing quote for a value"};

                item.value = item.value.substr(1, item.value.size()-2);
            }

            group->_values.push_back(item);
        }
    }

    if(multiLineValue)
        return {nullptr, "missing closing quotes for a multi-line value"};

    /* This was the last group */
    return {in, nullptr};
}